

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_python.cpp
# Opt level: O0

bool __thiscall
flatbuffers::python::PythonGenerator::SaveType
          (PythonGenerator *this,string *defname,Namespace *ns,string *classcode,ImportMap *imports,
          string *mod,bool needs_imports)

{
  bool bVar1;
  long lVar2;
  char *pcVar3;
  undefined1 auVar4 [16];
  undefined1 local_228 [8];
  string filename;
  string local_200;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c0;
  undefined1 local_1a0 [8];
  string init_py;
  size_t i;
  string directories;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  set<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_f8;
  allocator<char> local_b9;
  string local_b8;
  string local_98;
  allocator<char> local_61;
  undefined1 local_60 [8];
  string code;
  bool needs_imports_local;
  string *mod_local;
  ImportMap *imports_local;
  string *classcode_local;
  Namespace *ns_local;
  string *defname_local;
  PythonGenerator *this_local;
  
  code.field_2._M_local_buf[0xf] = needs_imports;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_60,"",&local_61);
  std::allocator<char>::~allocator(&local_61);
  auVar4 = std::__cxx11::string::empty();
  if ((auVar4 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    BaseGenerator::LastNamespacePart_abi_cxx11_
              ((string *)((long)&directories.field_2 + 8),(BaseGenerator *)ns,auVar4._8_8_);
    BeginFile(this,(string *)((long)&directories.field_2 + 8),
              (bool)(code.field_2._M_local_buf[0xf] & 1),(string *)local_60,mod,imports);
    std::__cxx11::string::~string((string *)(directories.field_2._M_local_buf + 8));
    std::__cxx11::string::operator+=((string *)local_60,(string *)classcode);
  }
  else {
    BaseGenerator::LastNamespacePart_abi_cxx11_(&local_98,(BaseGenerator *)ns,auVar4._8_8_);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_b8,"",&local_b9);
    local_f8._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
    local_f8._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_f8._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_f8._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
    local_f8._M_t._M_impl._0_8_ = 0;
    local_f8._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_f8._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
    std::
    set<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::set(&local_f8);
    BeginFile(this,&local_98,false,(string *)local_60,&local_b8,&local_f8);
    std::
    set<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~set(&local_f8);
    std::__cxx11::string::~string((string *)&local_b8);
    std::allocator<char>::~allocator(&local_b9);
    std::__cxx11::string::~string((string *)&local_98);
    std::operator+(&local_138,"# NOTE ",defname);
    std::operator+(&local_118,&local_138," does not declare any structs or enums\n");
    std::__cxx11::string::operator+=((string *)local_60,(string *)&local_118);
    std::__cxx11::string::~string((string *)&local_118);
    std::__cxx11::string::~string((string *)&local_138);
  }
  if (((((this->super_BaseGenerator).parser_)->opts).one_file & 1U) == 0) {
    Namer::Directories((string *)&i,&(this->namer_).super_Namer,&ns->components,None,kUpperCamel);
  }
  else {
    std::__cxx11::string::string((string *)&i,(string *)(this->super_BaseGenerator).path_);
  }
  EnsureDirExists((string *)&i);
  lVar2 = std::__cxx11::string::size();
  init_py.field_2._8_8_ = lVar2 + 1;
  while (init_py.field_2._8_8_ != -1) {
    std::__cxx11::string::substr((ulong)&local_1e0,(ulong)&i);
    std::operator+(&local_1c0,&local_1e0,'/');
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a0,
                   &local_1c0,"__init__.py");
    std::__cxx11::string::~string((string *)&local_1c0);
    std::__cxx11::string::~string((string *)&local_1e0);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_200,"",(allocator<char> *)(filename.field_2._M_local_buf + 0xf));
    SaveFile(pcVar3,&local_200,false);
    std::__cxx11::string::~string((string *)&local_200);
    std::allocator<char>::~allocator((allocator<char> *)(filename.field_2._M_local_buf + 0xf));
    std::__cxx11::string::~string((string *)local_1a0);
    init_py.field_2._8_8_ = std::__cxx11::string::find((char)&i,0x2f);
  }
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_228,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&i,defname);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  bVar1 = SaveFile(pcVar3,(string *)local_60,false);
  std::__cxx11::string::~string((string *)local_228);
  std::__cxx11::string::~string((string *)&i);
  std::__cxx11::string::~string((string *)local_60);
  return bVar1;
}

Assistant:

bool SaveType(const std::string &defname, const Namespace &ns,
                const std::string &classcode, const ImportMap &imports,
                const std::string &mod, bool needs_imports) const {
    std::string code = "";
    if (classcode.empty()) {
      BeginFile(LastNamespacePart(ns), false, &code, "", {});
      code += "# NOTE " + defname + " does not declare any structs or enums\n";
    } else {
      BeginFile(LastNamespacePart(ns), needs_imports, &code, mod, imports);
      code += classcode;
    }

    const std::string directories =
        parser_.opts.one_file ? path_ : namer_.Directories(ns.components);
    EnsureDirExists(directories);

    for (size_t i = path_.size() + 1; i != std::string::npos;
         i = directories.find(kPathSeparator, i + 1)) {
      const std::string init_py =
          directories.substr(0, i) + kPathSeparator + "__init__.py";
      SaveFile(init_py.c_str(), "", false);
    }

    const std::string filename = directories + defname;
    return SaveFile(filename.c_str(), code, false);
  }